

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

void __thiscall Inline::CloneCallSequence(Inline *this,Instr *callInstr,Instr *clonedCallInstr)

{
  OpCode opcode;
  _func_int **pp_Var1;
  SymTable *this_00;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  byte bVar6;
  ArgSlot argSlotNum;
  StackSym *pSVar7;
  undefined4 *puVar8;
  SymOpnd *dstOpnd;
  Instr *this_01;
  Opnd *pOVar9;
  Instr *pIVar10;
  Instr *pIVar11;
  Instr *pIVar12;
  Instr *local_40;
  
  pSVar7 = IR::Opnd::GetStackSym(callInstr->m_src2);
  if (((pSVar7->field_0x18 & 1) == 0) || ((pSVar7->field_5).m_instrDef == (Instr *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar4) goto LAB_0054f5a7;
    *puVar8 = 0;
  }
  pIVar10 = (pSVar7->field_5).m_instrDef;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  pIVar11 = (Instr *)0x0;
  local_40 = clonedCallInstr;
  do {
    if ((pIVar10->m_src2 == (Opnd *)0x0) ||
       (OVar5 = IR::Opnd::GetKind(pIVar10->m_src2), OVar5 != OpndKindSym)) {
LAB_0054f2ba:
      pIVar12 = (Instr *)0x0;
    }
    else {
      pOVar9 = pIVar10->m_src2;
      OVar5 = IR::Opnd::GetKind(pOVar9);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_0054f5a7;
        *puVar8 = 0;
      }
      pp_Var1 = pOVar9[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar4) goto LAB_0054f5a7;
        *puVar8 = 0;
      }
      if (((*(byte *)((long)pp_Var1 + 0x1a) & 0x10) != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)
         ) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar4) goto LAB_0054f5a7;
        *puVar8 = 0;
      }
      if ((*(byte *)((long)pp_Var1 + 0x1a) & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar4) goto LAB_0054f5a7;
        *puVar8 = 0;
      }
      if ((((((ulong)pp_Var1[3] & 1) == 0) || (pp_Var1[5] == (_func_int *)0x0)) &&
          (bVar4 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase), !bVar4)) &&
         (bVar4 = Func::IsInPhase(callInstr->m_func,FGBuildPhase), !bVar4)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar4) goto LAB_0054f5a7;
        *puVar8 = 0;
      }
      if (((ulong)pp_Var1[3] & 1) == 0) goto LAB_0054f2ba;
      pIVar12 = (Instr *)pp_Var1[5];
    }
    opcode = pIVar10->m_opcode;
    if (opcode != ArgOut_A_InlineSpecialized) {
      if (opcode == StartCall) {
        if (pIVar12 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar4) goto LAB_0054f5a7;
          *puVar8 = 0;
        }
        break;
      }
      this_00 = callInstr->m_func->m_symTable;
      pSVar7 = IR::Opnd::GetStackSym(pIVar10->m_dst);
      argSlotNum = StackSym::GetArgSlotNum(pSVar7);
      pSVar7 = SymTable::GetArgSlotSym(this_00,argSlotNum);
      dstOpnd = IR::SymOpnd::New(&pSVar7->super_Sym,0,pIVar10->m_dst->m_type,callInstr->m_func);
      this_01 = IR::Instr::New(opcode,&dstOpnd->super_Opnd,pIVar10->m_src1,callInstr->m_func);
      IR::Instr::SetByteCodeOffset(this_01,callInstr);
      pSVar7 = IR::Opnd::GetStackSym(this_01->m_dst);
      pSVar7->field_0x1b = pSVar7->field_0x1b | 2;
      pOVar9 = this_01->m_dst;
      if (local_40->m_src2 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
        if (!bVar4) goto LAB_0054f5a7;
        *puVar8 = 0;
      }
      pFVar2 = local_40->m_func;
      if (pOVar9->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar4) goto LAB_0054f5a7;
        *puVar8 = 0;
      }
      bVar6 = pOVar9->field_0xb;
      if ((bVar6 & 2) != 0) {
        pOVar9 = IR::Opnd::Copy(pOVar9,pFVar2);
        bVar6 = pOVar9->field_0xb;
      }
      pOVar9->field_0xb = bVar6 | 2;
      local_40->m_src2 = pOVar9;
      IR::Instr::InsertBefore(local_40,this_01);
      pIVar11 = pIVar10;
      local_40 = this_01;
    }
    pIVar10 = pIVar12;
  } while (pIVar12 != (Instr *)0x0);
  pSVar7 = IR::Opnd::GetStackSym(pIVar11->m_src2);
  if ((pSVar7->field_0x18 & 1) == 0) {
    pIVar10 = (Instr *)0x0;
  }
  else {
    pIVar10 = (pSVar7->field_5).m_instrDef;
  }
  pOVar9 = pIVar10->m_dst;
  if (local_40->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_0054f5a7;
    *puVar8 = 0;
  }
  pFVar2 = local_40->m_func;
  if (pOVar9->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) {
LAB_0054f5a7:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  bVar6 = pOVar9->field_0xb;
  if ((bVar6 & 2) != 0) {
    pOVar9 = IR::Opnd::Copy(pOVar9,pFVar2);
    bVar6 = pOVar9->field_0xb;
  }
  pOVar9->field_0xb = bVar6 | 2;
  local_40->m_src2 = pOVar9;
  return;
}

Assistant:

void Inline::CloneCallSequence(IR::Instr* callInstr, IR::Instr* clonedCallInstr)
{
    IR::Instr* previousArg = nullptr;
    IR::Instr* previousClonedArg = clonedCallInstr;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr){
        IR::Instr* cloneArg = IR::Instr::New(argInstr->m_opcode,
            IR::SymOpnd::New(callInstr->m_func->m_symTable->GetArgSlotSym(argInstr->GetDst()->GetStackSym()->GetArgSlotNum()), 0, argInstr->GetDst()->GetType(), callInstr->m_func),
            argInstr->GetSrc1(), callInstr->m_func);
        cloneArg->SetByteCodeOffset(callInstr);
        cloneArg->GetDst()->GetStackSym()->m_isArgCaptured = true;
        previousClonedArg->SetSrc2(cloneArg->GetDst());
        previousClonedArg->InsertBefore(cloneArg);
        previousArg = argInstr;
        previousClonedArg = cloneArg;
        return false;
    });
    IR::Instr* startCall = previousArg->GetSrc2()->GetStackSym()->GetInstrDef();
    previousClonedArg->SetSrc2(startCall->GetDst());

}